

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedPipelineStateImpl::
PrepareDefaultSignatureGL<Diligent::RayTracingPipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  undefined1 local_30 [8];
  vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> DummyShadersGL;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  SerializedPipelineStateImpl *this_local;
  
  DummyShadersGL.
  super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CreateInfo;
  std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::vector
            ((vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)local_30
            );
  CreateDefaultResourceSignature<Diligent::PipelineStateGLImpl,Diligent::PipelineResourceSignatureGLImpl,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            (this,OpenGL,
             (PipelineStateDesc *)
             DummyShadersGL.
             super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,SHADER_TYPE_UNKNOWN,
             (vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)local_30
            );
  std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::~vector
            ((vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)local_30
            );
  return;
}

Assistant:

void SerializedPipelineStateImpl::PrepareDefaultSignatureGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    // Add empty device signature - there must be some device-specific data for OpenGL in the archive
    // or there will be an error when unpacking the signature.
    std::vector<ShaderGLImpl*> DummyShadersGL;
    CreateDefaultResourceSignature<PipelineStateGLImpl, PipelineResourceSignatureGLImpl>(DeviceType::OpenGL, CreateInfo.PSODesc, SHADER_TYPE_UNKNOWN, DummyShadersGL);
}